

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  long lVar1;
  sqlite3 *db;
  Db *pDVar2;
  Btree *p;
  void *pvVar3;
  int iVar4;
  uchar *puVar5;
  HashElem *pHVar6;
  uchar *zName;
  char *zFormat;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  char zErr [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = sqlite3_value_text(*argv);
  zName = "";
  if (puVar5 != (uchar *)0x0) {
    zName = puVar5;
  }
  db = context->pOut->db;
  uVar8 = 0;
  uVar9 = (ulong)(uint)db->nDb;
  if (db->nDb < 1) {
    uVar9 = uVar8;
  }
  lVar7 = 0x18;
  do {
    if (uVar9 == uVar8) {
      zFormat = "no such database: %s";
LAB_00183c89:
      sqlite3_snprintf(0x80,zErr,zFormat,zName);
      sqlite3_result_error(context,zErr,-1);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
LAB_00183d3e:
      __stack_chk_fail();
    }
    pDVar2 = db->aDb;
    p = *(Btree **)((long)pDVar2 + lVar7 + -0x10);
    if (p != (Btree *)0x0) {
      iVar4 = sqlite3DbIsNamed(db,(int)uVar8,(char *)zName);
      if (iVar4 != 0) {
        if (uVar8 < 2) {
          zFormat = "cannot detach database %s";
        }
        else {
          zFormat = "database %s is locked";
          if ((p->inTrans == '\0') && (p->nBackup == 0)) {
            pHVar6 = (HashElem *)&((pDVar2[1].pSchema)->trigHash).first;
            while (pHVar6 = pHVar6->next, pHVar6 != (HashElem *)0x0) {
              pvVar3 = pHVar6->data;
              if (*(long *)((long)pvVar3 + 0x30) == *(long *)((long)&pDVar2->zDbSName + lVar7)) {
                *(undefined8 *)((long)pvVar3 + 0x30) = *(undefined8 *)((long)pvVar3 + 0x28);
              }
            }
            sqlite3BtreeClose(p);
            *(undefined8 *)((long)pDVar2 + lVar7 + -0x10) = 0;
            *(undefined8 *)((long)&pDVar2->zDbSName + lVar7) = 0;
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              sqlite3CollapseDatabaseArray(db);
              return;
            }
            goto LAB_00183d3e;
          }
        }
        goto LAB_00183c89;
      }
    }
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 0x20;
  } while( true );
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  HashElem *pEntry;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3DbIsNamed(db, i, zName) ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( sqlite3BtreeTxnState(pDb->pBt)!=SQLITE_TXN_NONE
   || sqlite3BtreeIsInBackup(pDb->pBt)
  ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  /* If any TEMP triggers reference the schema being detached, move those
  ** triggers to reference the TEMP schema itself. */
  assert( db->aDb[1].pSchema );
  pEntry = sqliteHashFirst(&db->aDb[1].pSchema->trigHash);
  while( pEntry ){
    Trigger *pTrig = (Trigger*)sqliteHashData(pEntry);
    if( pTrig->pTabSchema==pDb->pSchema ){
      pTrig->pTabSchema = pTrig->pSchema;
    }
    pEntry = sqliteHashNext(pEntry);
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}